

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texture_size_invalid_lod
               (NegativeTestContext *ctx)

{
  DataType dataType;
  string shaderSource_00;
  bool bVar1;
  ContextType CVar2;
  char *pcVar3;
  long *plVar4;
  size_t sVar5;
  ostream *poVar6;
  ShaderType shaderType;
  size_type *psVar7;
  DataType dataType_00;
  DataType dataType_01;
  long lVar8;
  ShaderType shaderType_00;
  string shaderSource;
  ostringstream source;
  ShaderType SVar9;
  DataType dataType_02;
  _Alloc_hider in_stack_fffffffffffffd00;
  size_type in_stack_fffffffffffffd08;
  undefined8 in_stack_fffffffffffffd10;
  long *local_2e0;
  size_type *local_2d8;
  long local_2d0 [2];
  string local_2c0;
  string local_2a0;
  long *local_280;
  long local_278;
  long local_270 [2];
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  long local_1e0;
  NegativeTestContext *local_1d8;
  long local_1d0;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"textureSize: Invalid lod type.","");
  NegativeTestContext::beginSection(ctx,(string *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  lVar8 = 0;
  local_1d8 = ctx;
  do {
    shaderType_00 = (&NegativeTestShared::(anonymous_namespace)::s_shaders)[lVar8];
    bVar1 = NegativeTestContext::isShaderSupported(ctx,shaderType_00);
    if (bVar1) {
      pcVar3 = glu::getShaderTypeName(shaderType_00);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xfffffffffffffd00,pcVar3,(allocator<char> *)&local_200);
      plVar4 = (long *)std::__cxx11::string::replace
                                 ((ulong)&stack0xfffffffffffffd00,0,(char *)0x0,0x1c79853);
      psVar7 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar7) {
        local_1a8._16_8_ = *psVar7;
        local_1a8._24_8_ = plVar4[3];
        local_1a8._0_8_ = local_1a8 + 0x10;
      }
      else {
        local_1a8._16_8_ = *psVar7;
        local_1a8._0_8_ = (size_type *)*plVar4;
      }
      local_1a8._8_8_ = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      NegativeTestContext::beginSection(ctx,(string *)local_1a8);
      local_1e0 = lVar8;
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if (in_stack_fffffffffffffd00._M_p != &stack0xfffffffffffffd10) {
        operator_delete(in_stack_fffffffffffffd00._M_p,in_stack_fffffffffffffd10 + 1);
      }
      lVar8 = 0;
      SVar9 = shaderType_00;
      do {
        CVar2.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
        bVar1 = glu::contextSupports(CVar2,(ApiType)0x23);
        dataType_02 = (&NegativeTestShared::(anonymous_namespace)::s_samplerTypes)[lVar8];
        if (bVar1) {
LAB_015f127d:
          pcVar3 = glu::getDataTypeName(dataType_02);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&stack0xfffffffffffffd00,pcVar3,(allocator<char> *)&local_200);
          plVar4 = (long *)std::__cxx11::string::replace
                                     ((ulong)&stack0xfffffffffffffd00,0,(char *)0x0,0x1c7b7e4);
          psVar7 = (size_type *)(plVar4 + 2);
          if ((size_type *)*plVar4 == psVar7) {
            local_1a8._16_8_ = *psVar7;
            local_1a8._24_8_ = plVar4[3];
            local_1a8._0_8_ = local_1a8 + 0x10;
          }
          else {
            local_1a8._16_8_ = *psVar7;
            local_1a8._0_8_ = (size_type *)*plVar4;
          }
          local_1a8._8_8_ = plVar4[1];
          *plVar4 = (long)psVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          NegativeTestContext::beginSection(ctx,(string *)local_1a8);
          local_1d0 = lVar8;
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          if (in_stack_fffffffffffffd00._M_p != &stack0xfffffffffffffd10) {
            operator_delete(in_stack_fffffffffffffd00._M_p,in_stack_fffffffffffffd10 + 1);
          }
          lVar8 = 0;
          do {
            shaderType = (ShaderType)psVar7;
            dataType = *(DataType *)
                        ((long)&NegativeTestShared::(anonymous_namespace)::s_nonScalarIntTypes +
                        lVar8);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            CVar2.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
            bVar1 = glu::contextSupports(CVar2,(ApiType)0x23);
            pcVar3 = glu::getGLSLVersionDeclaration(bVar1 | GLSL_VERSION_310_ES);
            if (pcVar3 == (char *)0x0) {
              std::ios::clear((int)&stack0xfffffffffffffcf8 +
                              (int)*(undefined8 *)(local_1a8._0_8_ + -0x18) + 0x160);
            }
            else {
              sVar5 = strlen(pcVar3);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar5);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
            NegativeTestShared::(anonymous_namespace)::getDataTypeExtension_abi_cxx11_
                      (&local_200,(_anonymous_namespace_ *)(ulong)dataType_02,dataType_01);
            getShaderExtensionDeclaration((string *)&stack0xfffffffffffffd00,&local_200);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,in_stack_fffffffffffffd00._M_p,
                                in_stack_fffffffffffffd08);
            NegativeTestShared::(anonymous_namespace)::getShaderInitialization_abi_cxx11_
                      (&local_220,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType_00,shaderType);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,local_220._M_dataplus._M_p,local_220._M_string_length);
            local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
            local_2a0.field_2._M_allocated_capacity._0_4_ = 0x706d6173;
            local_2a0._M_string_length = 7;
            local_2a0.field_2._M_allocated_capacity._4_4_ = 0x72656c;
            declareShaderUniform(&local_240,dataType_02,&local_2a0);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,local_240._M_dataplus._M_p,local_240._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"void main(void)\n",0x10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"{\n",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    ",4);
            local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
            local_2c0.field_2._M_local_buf[2] = 'd';
            local_2c0.field_2._M_allocated_capacity._0_2_ = 0x6f6c;
            local_2c0._M_string_length = 3;
            local_2c0.field_2._M_local_buf[3] = '\0';
            declareAndInitializeShaderVariable(&local_260,dataType,&local_2c0);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,local_260._M_dataplus._M_p,local_260._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,"    textureSize(sampler, lod);\n",0x1f);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}\n",2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p != &local_260.field_2) {
              operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
              operator_delete(local_2c0._M_dataplus._M_p,
                              CONCAT44(local_2c0.field_2._M_allocated_capacity._4_4_,
                                       CONCAT13(local_2c0.field_2._M_local_buf[3],
                                                CONCAT12(local_2c0.field_2._M_local_buf[2],
                                                         local_2c0.field_2._M_allocated_capacity.
                                                         _0_2_))) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_240._M_dataplus._M_p != &local_240.field_2) {
              operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
              operator_delete(local_2a0._M_dataplus._M_p,
                              CONCAT44(local_2a0.field_2._M_allocated_capacity._4_4_,
                                       local_2a0.field_2._M_allocated_capacity._0_4_) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != &local_220.field_2) {
              operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1
                             );
            }
            if (in_stack_fffffffffffffd00._M_p != &stack0xfffffffffffffd10) {
              operator_delete(in_stack_fffffffffffffd00._M_p,in_stack_fffffffffffffd10 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_200._M_dataplus._M_p != &local_200.field_2) {
              operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            local_2e0 = local_2d0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2e0,local_280,local_278 + (long)local_280);
            shaderSource_00._M_dataplus._M_p._4_4_ = dataType_02;
            shaderSource_00._M_dataplus._M_p._0_4_ = SVar9;
            shaderSource_00._M_string_length = (size_type)in_stack_fffffffffffffd00._M_p;
            shaderSource_00.field_2._M_allocated_capacity = in_stack_fffffffffffffd08;
            shaderSource_00.field_2._8_8_ = in_stack_fffffffffffffd10;
            psVar7 = local_2d8;
            verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType_00,
                         (ShaderType)local_2e0,shaderSource_00);
            if (local_2e0 != local_2d0) {
              operator_delete(local_2e0,local_2d0[0] + 1);
            }
            if (local_280 != local_270) {
              operator_delete(local_280,local_270[0] + 1);
            }
            lVar8 = lVar8 + 4;
          } while (lVar8 != 0x2c);
          NegativeTestContext::endSection(ctx);
          lVar8 = local_1d0;
        }
        else {
          NegativeTestShared::(anonymous_namespace)::getDataTypeExtension_abi_cxx11_
                    (&local_1c8,(_anonymous_namespace_ *)(ulong)dataType_02,dataType_00);
          bVar1 = NegativeTestContext::isExtensionSupported(local_1d8,&local_1c8);
          shaderType_00 = SVar9;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
            shaderType_00 = SVar9;
          }
          SVar9 = shaderType_00;
          if (bVar1) goto LAB_015f127d;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x1c);
      NegativeTestContext::endSection(ctx);
      lVar8 = local_1e0;
    }
    lVar8 = lVar8 + 1;
    if (lVar8 == 6) {
      NegativeTestContext::endSection(ctx);
      return;
    }
  } while( true );
}

Assistant:

void texture_size_invalid_lod (NegativeTestContext& ctx)
{
	ctx.beginSection("textureSize: Invalid lod type.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_samplerTypes); ++dataTypeNdx)
			{
				if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(getDataTypeExtension(s_samplerTypes[dataTypeNdx])))
				{
					ctx.beginSection("Verify sampler/lod data type" + std::string(getDataTypeName(s_samplerTypes[dataTypeNdx])));
					for (int dataTypeNdx2 = 0; dataTypeNdx2 < DE_LENGTH_OF_ARRAY(s_nonScalarIntTypes); ++dataTypeNdx2)
					{
						if (s_nonScalarIntTypes[dataTypeNdx2] == glu::TYPE_INT)
							continue;

						const std::string shaderSource(genShaderSourceTextureSize_lod(ctx, s_shaders[shaderNdx], s_samplerTypes[dataTypeNdx], s_nonScalarIntTypes[dataTypeNdx2]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					ctx.endSection();
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}